

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef BinaryenReturn(BinaryenModuleRef module,BinaryenExpressionRef value)

{
  BinaryenExpressionRef pEVar1;
  
  pEVar1 = (BinaryenExpressionRef)MixedArena::allocSpace(&module->allocator,0x18,8);
  pEVar1->_id = ReturnId;
  (pEVar1->type).id = 0;
  *(undefined8 *)(pEVar1 + 1) = 0;
  (pEVar1->type).id = 1;
  *(BinaryenExpressionRef *)(pEVar1 + 1) = value;
  return pEVar1;
}

Assistant:

BinaryenExpressionRef BinaryenReturn(BinaryenModuleRef module,
                                     BinaryenExpressionRef value) {
  auto* ret = Builder(*(Module*)module).makeReturn((Expression*)value);
  return static_cast<Expression*>(ret);
}